

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::drawCenterHandle(XFormWidget *this)

{
  ulong uVar1;
  double dVar2;
  pointer pVVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dStack_d0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  dVar8 = (this->center).x;
  dVar9 = (this->center).y;
  dVar6 = (this->bounds).max.x - (this->bounds).min.x;
  dVar12 = (this->bounds).max.y - (this->bounds).min.y;
  dVar2 = (this->center).z;
  dVar13 = (this->bounds).max.z - (this->bounds).min.z;
  dVar6 = SQRT(dVar13 * dVar13 + dVar6 * dVar6 + dVar12 * dVar12) * 0.5;
  glBegin(7);
  glColor4ubv((this->axisColors).
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  dVar12 = dVar6 * 0.15;
  auVar5._8_4_ = SUB84(dVar12,0);
  auVar5._0_8_ = dVar12;
  auVar5._12_4_ = (int)((ulong)dVar12 >> 0x20);
  uVar1 = 0;
  while (uVar10 = uVar1, uVar10 != 3) {
    uVar1 = uVar10 + 1;
    uVar11 = 0;
    if (uVar1 != 3) {
      uVar11 = uVar1 & 0xffffffff;
    }
    uVar4 = (ulong)((int)uVar10 + 2) % 3;
    for (dVar13 = -1.0; dVar13 <= 1.0; dVar13 = dVar13 + 2.0) {
      dVar7 = dVar6 * dVar13 * 0.15;
      pVVar3 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_98 = pVVar3[uVar10].z * dVar7 + dVar2;
      local_a8 = dVar7 * pVVar3[uVar10].x + dVar8;
      dStack_a0 = dVar7 * pVVar3[uVar10].y + dVar9;
      dStack_d0 = auVar5._8_8_;
      local_48 = (-pVVar3[uVar11].x - pVVar3[uVar4].x) * dVar12 + local_a8;
      dStack_40 = (-pVVar3[uVar11].y - pVVar3[uVar4].y) * dStack_d0 + dStack_a0;
      local_38 = (-pVVar3[uVar11].z - pVVar3[uVar4].z) * dVar12 + local_98;
      local_58 = (pVVar3[uVar4].z - pVVar3[uVar11].z) * dVar12 + local_98;
      local_68 = (pVVar3[uVar4].x - pVVar3[uVar11].x) * dVar12 + local_a8;
      dStack_60 = (pVVar3[uVar4].y - pVVar3[uVar11].y) * dStack_d0 + dStack_a0;
      local_78 = (pVVar3[uVar11].z - pVVar3[uVar4].z) * dVar12 + local_98;
      local_88 = (pVVar3[uVar11].x - pVVar3[uVar4].x) * dVar12 + local_a8;
      dStack_80 = (pVVar3[uVar11].y - pVVar3[uVar4].y) * dStack_d0 + dStack_a0;
      local_98 = (pVVar3[uVar11].z + pVVar3[uVar4].z) * dVar12 + local_98;
      local_a8 = (pVVar3[uVar4].x + pVVar3[uVar11].x) * dVar12 + local_a8;
      dStack_a0 = (pVVar3[uVar4].y + pVVar3[uVar11].y) * dStack_d0 + dStack_a0;
      glVertex3dv(&local_48);
      glVertex3dv(&local_68);
      glVertex3dv(&local_a8);
      glVertex3dv(&local_88);
    }
  }
  glEnd();
  return;
}

Assistant:

void XFormWidget::drawCenterHandle() const
{
   const double handleSize = .15;
   
   Vector3D c = center;

   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw center box
   glBegin( GL_QUADS );
   glColor4ubv( &axisColors[3][0] );
   for( int i = 0; i < 3; i++ )
   {
      for( double s = -1.; s <= 1.; s+= 2. )
      {
         Vector3D p = c + r*s*handleSize*axes[i];
         Vector3D p00 = p + r*handleSize*( -axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p01 = p + r*handleSize*( -axes[(i+1)%3] + axes[(i+2)%3] );
         Vector3D p10 = p + r*handleSize*(  axes[(i+1)%3] - axes[(i+2)%3] );
         Vector3D p11 = p + r*handleSize*(  axes[(i+1)%3] + axes[(i+2)%3] );

         glVertex3dv( &p00.x );
         glVertex3dv( &p01.x );
         glVertex3dv( &p11.x );
         glVertex3dv( &p10.x );
      }
   }
   glEnd();
}